

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 IVar3;
  float local_84;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  byte local_4d;
  bool fully_visible;
  undefined4 local_44;
  undefined4 local_40;
  float DISTANCE;
  float THICKNESS;
  ImRect display_rect;
  float rounding;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiNavHighlightFlags flags_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  if ((id == GImGui->NavId) &&
     ((((GImGui->NavDisableHighlight & 1U) == 0 || ((flags & 4U) != 0)) &&
      (register0x00000000 = GetCurrentWindow(),
      ((register0x00000000->DC).NavHideHighlightOneFrame & 1U) == 0)))) {
    if ((flags & 8U) == 0) {
      local_84 = (pIVar2->Style).FrameRounding;
    }
    else {
      local_84 = 0.0;
    }
    display_rect.Max.x = local_84;
    _DISTANCE = bb->Min;
    display_rect.Min = bb->Max;
    ImRect::ClipWith((ImRect *)&DISTANCE,&register0x00000000->ClipRect);
    if ((flags & 1U) != 0) {
      local_40 = 0x40000000;
      local_44 = 0x40800000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,4.0,4.0);
      ImRect::Expand((ImRect *)&DISTANCE,(ImVec2 *)&stack0xffffffffffffffb4);
      local_4d = ImRect::Contains(&stack0xffffffffffffffd8->ClipRect,(ImRect *)&DISTANCE);
      if (!(bool)local_4d) {
        local_58 = _DISTANCE;
        local_60 = display_rect.Min;
        ImDrawList::PushClipRect(stack0xffffffffffffffd8->DrawList,_DISTANCE,display_rect.Min,false)
        ;
      }
      pIVar1 = stack0xffffffffffffffd8->DrawList;
      ImVec2::ImVec2(&local_70,1.0,1.0);
      local_68 = ::operator+((ImVec2 *)&DISTANCE,&local_70);
      ImVec2::ImVec2(&local_80,1.0,1.0);
      local_78 = ::operator-(&display_rect.Min,&local_80);
      IVar3 = GetColorU32(0x28,1.0);
      ImDrawList::AddRect(pIVar1,&local_68,&local_78,IVar3,display_rect.Max.x,0xf,2.0);
      if ((local_4d & 1) == 0) {
        ImDrawList::PopClipRect(stack0xffffffffffffffd8->DrawList);
      }
    }
    if ((flags & 2U) != 0) {
      pIVar1 = stack0xffffffffffffffd8->DrawList;
      IVar3 = GetColorU32(0x28,1.0);
      ImDrawList::AddRect(pIVar1,(ImVec2 *)&DISTANCE,&display_rect.Min,IVar3,display_rect.Max.x,-1,
                          1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE,DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS*0.5f,THICKNESS*0.5f), display_rect.Max - ImVec2(THICKNESS*0.5f,THICKNESS*0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}